

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O3

void __thiscall
db_unpacker::extract_1114(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  bool bVar4;
  int iVar5;
  uint8_t *puVar6;
  long lVar7;
  undefined8 *puVar8;
  _lzhuf *this_00;
  uint8_t *puVar9;
  ulong uVar10;
  uint8_t *p;
  string folder;
  string path;
  string temp;
  size_t real_size;
  uint8_t *local_a8;
  string local_a0;
  string *local_80;
  undefined8 local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string *local_40;
  size_t local_38;
  
  local_40 = prefix;
  if (xray_re::xr_file_system::instance()::instance0 == '\0') {
    iVar5 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0);
    if (iVar5 != 0) {
      xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
      __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                   &xray_re::xr_file_system::instance::instance0,&__dso_handle);
      __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
    }
  }
  local_70._16_8_ = &local_50;
  local_70._24_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_80 = (string *)local_70;
  local_78 = 0;
  local_70[0] = 0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  puVar6 = (s->field_2).m_p;
  puVar9 = s->m_end;
  if (puVar6 <= puVar9) {
    do {
      if (puVar6 == puVar9) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        if (local_80 != (string *)local_70) {
          operator_delete(local_80,CONCAT71(local_70._1_7_,local_70[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._16_8_ != &local_50) {
          operator_delete((void *)local_70._16_8_,
                          CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) +
                          1);
        }
        return;
      }
      xray_re::xr_reader::r_sz(s,(string *)(local_70 + 0x10));
      puVar3 = (s->field_2).m_p_u32;
      (s->field_2).m_p = (uint8_t *)(puVar3 + 1);
      uVar1 = *puVar3;
      (s->field_2).m_p = (uint8_t *)(puVar3 + 2);
      uVar10 = (ulong)puVar3[1];
      (s->field_2).m_p = (uint8_t *)(puVar3 + 3);
      uVar2 = puVar3[2];
      if (mask->_M_string_length == 0 || uVar10 == 0) {
LAB_001201af:
        std::__cxx11::string::_M_assign((string *)&local_80);
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,local_70._16_8_);
        xray_re::xr_file_system::split_path((char *)*puVar8,&local_a0,(string *)0x0,(string *)0x0);
        bVar4 = xray_re::xr_file_system::folder_exist(local_a0._M_dataplus._M_p);
        if (!bVar4) {
          xray_re::xr_file_system::create_path
                    (&xray_re::xr_file_system::instance::instance0,local_a0._M_dataplus._M_p);
        }
        if (uVar1 == 0) {
          this_00 = &xray_re::xr_lzhuf::instance()->m_lzhuf;
          xray_re::_lzhuf::Decode(this_00,&local_a8,&local_38,data + uVar10,(ulong)uVar2);
          if (local_38 != 0) {
            write_file(&xray_re::xr_file_system::instance::instance0,local_80,local_a8,local_38);
          }
          free(local_a8);
        }
        else {
          write_file(&xray_re::xr_file_system::instance::instance0,local_80,data + uVar10,
                     (ulong)uVar2);
        }
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)&local_80,(ulong)(mask->_M_dataplus)._M_p,0);
        if (lVar7 != -1) goto LAB_001201af;
      }
      puVar6 = (s->field_2).m_p;
      puVar9 = s->m_end;
    } while (puVar6 <= puVar9);
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                ,0x7e,"bool xray_re::xr_reader::eof() const");
}

Assistant:

void db_unpacker::extract_1114(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string temp, path, folder; !s->eof(); ) {
		s->r_sz(temp);
		unsigned uncompressed = s->r_u32();
		unsigned offset = s->r_u32();
		unsigned size = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", temp.c_str());
			msg("  offset: %u", offset);
			if (uncompressed)
				msg("  size (real): %u", size);
			else
				msg("  size (compressed): %u", size);
		} else {
			path = prefix;
			fs.split_path(path.append(temp), &folder);
			if (!fs.folder_exist(folder))
				fs.create_path(folder);
			if (uncompressed) {
				write_file(fs, path, data + offset, size);
			} else {
				size_t real_size;
				uint8_t* p;
				xr_lzhuf::decompress(p, real_size, data + offset, size);
				if (real_size)
					write_file(fs, path, p, real_size);
				free(p);
			}
		}
	}
}